

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O2

GrcEnv * __thiscall
GrcManager::PushTableEnv(GrcManager *this,GrpLineAndFile *lnf,string *staTableName)

{
  GrcSymbolTable *this_00;
  pointer pGVar1;
  bool bVar2;
  int iVar3;
  Symbol this_01;
  GrcEnv *pGVar4;
  iterator iVar5;
  Symbol psymTable;
  pair<GrcSymbolTableEntry_*,_int> local_98;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_48,(string *)staTableName);
  this_01 = GrcSymbolTable::FindSymbol(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  psymTable = this_01;
  if ((this_01 != (Symbol)0x0) &&
     (bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_01,ksymtTable), bVar2)) {
    pGVar1 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_98.first = pGVar1[-1].m_psymTable;
    local_98.second = pGVar1[-1].m_nPass;
    std::
    _Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
    ::_M_emplace_unique<std::pair<GrcSymbolTableEntry*,int>&>
              ((_Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,int>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,int>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
                *)&this->m_hmpsymnCurrPass,&local_98);
    pGVar4 = PushEnvAux(this);
    pGVar4->m_psymTable = this_01;
    iVar5 = std::
            _Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_int>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_int>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
            ::find(&(this->m_hmpsymnCurrPass)._M_t,&psymTable);
    if ((_Rb_tree_header *)iVar5._M_node ==
        &(this->m_hmpsymnCurrPass)._M_t._M_impl.super__Rb_tree_header) {
      iVar3 = 0;
    }
    else {
      iVar3 = *(int *)&iVar5._M_node[1]._M_parent;
    }
    pGVar4->m_nPass = iVar3;
    return pGVar4;
  }
  std::__cxx11::string::string((string *)&local_68,"Invalid table name: ",(allocator *)&local_98);
  std::__cxx11::string::string((string *)&local_88,(string *)staTableName);
  GrcErrorList::AddError(&g_errorList,0x49d,(GdlObject *)0x0,&local_68,&local_88,lnf);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  pGVar4 = PushEnvAux(this);
  return pGVar4;
}

Assistant:

GrcEnv * GrcManager::PushTableEnv(GrpLineAndFile & lnf, std::string staTableName)
{
	Symbol psymTable = SymbolTable()->FindSymbol(staTableName);
	if (!psymTable || !psymTable->FitsSymbolType(ksymtTable))
	{
		g_errorList.AddError(1181, NULL,
			"Invalid table name: ",
			staTableName,
			lnf);
		return PushGeneralEnv(lnf);	// just push a copy of current env
	}
	else
	{
		GrcEnv * penvPrev = &(m_venv[m_venv.size() - 1]);
		Symbol psymPrevTable = penvPrev->Table();
		int nPrevPass = penvPrev->Pass();
		std::pair<Symbol, int> hmpair;
		hmpair.first = psymPrevTable;
		hmpair.second = nPrevPass;
		m_hmpsymnCurrPass.insert(hmpair);
		//m_hmpsymnCurrPass.Insert(psymPrevTable, nPrevPass, true);

		GrcEnv * penvNew = PushEnvAux();

		penvNew->SetTable(psymTable);
		int nPass = 0;
		std::map<Symbol, int>::iterator hmit = m_hmpsymnCurrPass.find(psymTable);
		if (hmit != m_hmpsymnCurrPass.end())
			nPass = hmit->second;
		//m_hmpsymnCurrPass.Retrieve(psymTable, &nPass);
		penvNew->SetPass(nPass);

		return penvNew;
	}
}